

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicVariousTessLevelsPosAttrCase::deinit
          (BasicVariousTessLevelsPosAttrCase *this)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  
  pSVar2 = (this->m_program).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_program).m_ptr = (ShaderProgram *)0x0;
      (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_program).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->m_program).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_program).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  (this->m_program).m_ptr = (ShaderProgram *)0x0;
  (this->m_program).m_state = (SharedPtrStateBase *)0x0;
  return;
}

Assistant:

void BasicVariousTessLevelsPosAttrCase::deinit (void)
{
	m_program.clear();
}